

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_sPLT(png_const_structrp png_ptr,png_inforp info_ptr,png_const_sPLT_tp entries,
                 int nentries)

{
  byte *pbVar1;
  uint uVar2;
  png_sPLT_tp ppVar3;
  size_t sVar4;
  png_charp __dest;
  png_sPLT_entryp __dest_00;
  char *pcVar5;
  
  if ((((entries != (png_const_sPLT_tp)0x0) && (png_ptr != (png_const_structrp)0x0)) &&
      (info_ptr != (png_inforp)0x0)) && (0 < nentries)) {
    ppVar3 = (png_sPLT_tp)
             png_realloc_array(png_ptr,info_ptr->splt_palettes,info_ptr->splt_palettes_num,nentries,
                               0x20);
    if (ppVar3 == (png_sPLT_tp)0x0) {
      pcVar5 = "too many sPLT chunks";
LAB_0011ba51:
      png_chunk_report(png_ptr,pcVar5,1);
      return;
    }
    png_free(png_ptr,info_ptr->splt_palettes);
    info_ptr->splt_palettes = ppVar3;
    *(byte *)&info_ptr->free_me = (byte)info_ptr->free_me | 0x20;
    ppVar3 = ppVar3 + info_ptr->splt_palettes_num;
    do {
      pcVar5 = entries->name;
      if ((pcVar5 != (char *)0x0) && (entries->entries != (png_sPLT_entryp)0x0)) {
        ppVar3->depth = entries->depth;
        sVar4 = strlen(pcVar5);
        __dest = (png_charp)png_malloc_base(png_ptr,sVar4 + 1);
        ppVar3->name = __dest;
        if (__dest != (png_charp)0x0) {
          memcpy(__dest,entries->name,sVar4 + 1);
          __dest_00 = (png_sPLT_entryp)png_malloc_array(png_ptr,entries->nentries,10);
          ppVar3->entries = __dest_00;
          if (__dest_00 != (png_sPLT_entryp)0x0) {
            uVar2 = entries->nentries;
            ppVar3->nentries = uVar2;
            memcpy(__dest_00,entries->entries,(ulong)uVar2 * 10);
            pbVar1 = (byte *)((long)&info_ptr->valid + 1);
            *pbVar1 = *pbVar1 | 0x20;
            info_ptr->splt_palettes_num = info_ptr->splt_palettes_num + 1;
            ppVar3 = ppVar3 + 1;
            entries = entries + 1;
            goto LAB_0011ba22;
          }
          png_free(png_ptr,ppVar3->name);
          ppVar3->name = (png_charp)0x0;
        }
        if (nentries < 1) {
          return;
        }
        pcVar5 = "sPLT out of memory";
        goto LAB_0011ba51;
      }
      png_app_error(png_ptr,"png_set_sPLT: invalid sPLT");
LAB_0011ba22:
      nentries = nentries + -1;
    } while (nentries != 0);
  }
  return;
}

Assistant:

void PNGAPI
png_set_sPLT(png_const_structrp png_ptr,
    png_inforp info_ptr, png_const_sPLT_tp entries, int nentries)
/*
 *  entries        - array of png_sPLT_t structures
 *                   to be added to the list of palettes
 *                   in the info structure.
 *
 *  nentries       - number of palette structures to be
 *                   added.
 */
{
   png_sPLT_tp np;

   if (png_ptr == NULL || info_ptr == NULL || nentries <= 0 || entries == NULL)
      return;

   /* Use the internal realloc function, which checks for all the possible
    * overflows.  Notice that the parameters are (int) and (size_t)
    */
   np = png_voidcast(png_sPLT_tp,png_realloc_array(png_ptr,
       info_ptr->splt_palettes, info_ptr->splt_palettes_num, nentries,
       sizeof *np));

   if (np == NULL)
   {
      /* Out of memory or too many chunks */
      png_chunk_report(png_ptr, "too many sPLT chunks", PNG_CHUNK_WRITE_ERROR);

      return;
   }

   png_free(png_ptr, info_ptr->splt_palettes);
   info_ptr->splt_palettes = np;
   info_ptr->free_me |= PNG_FREE_SPLT;

   np += info_ptr->splt_palettes_num;

   do
   {
      size_t length;

      /* Skip invalid input entries */
      if (entries->name == NULL || entries->entries == NULL)
      {
         /* png_handle_sPLT doesn't do this, so this is an app error */
         png_app_error(png_ptr, "png_set_sPLT: invalid sPLT");
         /* Just skip the invalid entry */
         continue;
      }

      np->depth = entries->depth;

      /* In the event of out-of-memory just return - there's no point keeping
       * on trying to add sPLT chunks.
       */
      length = strlen(entries->name) + 1;
      np->name = png_voidcast(png_charp, png_malloc_base(png_ptr, length));

      if (np->name == NULL)
         break;

      memcpy(np->name, entries->name, length);

      /* IMPORTANT: we have memory now that won't get freed if something else
       * goes wrong; this code must free it.  png_malloc_array produces no
       * warnings; use a png_chunk_report (below) if there is an error.
       */
      np->entries = png_voidcast(png_sPLT_entryp, png_malloc_array(png_ptr,
          entries->nentries, sizeof (png_sPLT_entry)));

      if (np->entries == NULL)
      {
         png_free(png_ptr, np->name);
         np->name = NULL;
         break;
      }

      np->nentries = entries->nentries;
      /* This multiply can't overflow because png_malloc_array has already
       * checked it when doing the allocation.
       */
      memcpy(np->entries, entries->entries,
          (unsigned int)entries->nentries * sizeof (png_sPLT_entry));

      /* Note that 'continue' skips the advance of the out pointer and out
       * count, so an invalid entry is not added.
       */
      info_ptr->valid |= PNG_INFO_sPLT;
      ++(info_ptr->splt_palettes_num);
      ++np;
      ++entries;
   }
   while (--nentries);

   if (nentries > 0)
      png_chunk_report(png_ptr, "sPLT out of memory", PNG_CHUNK_WRITE_ERROR);
}